

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTable.cpp
# Opt level: O2

ByteArray * __thiscall
EncodingTable::encodeTermination(ByteArray *__return_storage_ptr__,EncodingTable *this)

{
  size_t i;
  ulong uVar1;
  
  ByteArray::ByteArray(__return_storage_ptr__);
  for (uVar1 = 0; uVar1 < (this->terminationEntry).hexLen; uVar1 = uVar1 + 1) {
    ByteArray::appendByte
              (__return_storage_ptr__,(this->hexData).data_[uVar1 + (this->terminationEntry).hexPos]
              );
  }
  return __return_storage_ptr__;
}

Assistant:

ByteArray EncodingTable::encodeTermination()
{
	ByteArray result;

	TableEntry& entry = terminationEntry;
	for (size_t i = 0; i < entry.hexLen; i++)
	{
		result.appendByte(hexData[entry.hexPos+i]);
	}

	return result;
}